

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_5908b1::TestPresetExecutionShowOnlyHelper(ShowOnlyEnum *out,Value *value)

{
  bool bVar1;
  ShowOnlyEnum SVar2;
  ReadFileResult RVar3;
  String SStack_48;
  
  RVar3 = INVALID_PRESET;
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isString(value), bVar1)) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"human");
    std::__cxx11::string::~string((string *)&SStack_48);
    SVar2 = Human;
    if (!bVar1) {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"json-v1");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (!bVar1) {
        return INVALID_PRESET;
      }
      SVar2 = JsonV1;
    }
    *out = SVar2;
    RVar3 = READ_OK;
  }
  return RVar3;
}

Assistant:

ReadFileResult TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value)
{
  if (!value || !value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}